

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodPropertyScoped_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar1;
  InlineCache *inlineCache;
  
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  pvVar1 = GetReg<unsigned_short>(this,playout->Instance);
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  pvVar1 = JavascriptOperators::PatchScopedGetMethod<false,Js::InlineCache>
                     (functionBody,inlineCache,(uint)playout->inlineCacheIndex,pvVar1,propertyId);
  SetReg<unsigned_short>(this,playout->Value,pvVar1);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetMethodPropertyScoped_NoFastPath(unaligned T *playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Js::Var instance = GetReg(playout->Instance);

        Js::Var value = JavascriptOperators::PatchScopedGetMethod<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            instance,
            propertyId
            );

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetMethodProperty(instance, propertyId, value, true);
        }
#endif

    }